

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

void __thiscall Js::CompoundString::Grow(CompoundString *this)

{
  Type *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Block *pBVar4;
  
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3b1,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) goto LAB_00a08d9f;
    *puVar3 = 0;
  }
  if (this->ownsLastBlock == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3b2,"(OwnsLastBlock())","OwnsLastBlock()");
    if (!bVar2) {
LAB_00a08d9f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pBVar4 = (this->lastBlock).ptr;
  this_00 = &this->lastBlockInfo;
  if (pBVar4 == (Block *)0x0) {
    pBVar4 = BlockInfo::Resize(this_00,((((this->super_LiteralString).super_JavascriptString.
                                          super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
                                       ->recycler);
  }
  else {
    BlockInfo::CopyTo(this_00,pBVar4);
    pBVar4 = Block::Chain(pBVar4,((((this->super_LiteralString).super_JavascriptString.
                                    super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                                 recycler);
    BlockInfo::CopyFrom(this_00,pBVar4);
  }
  Memory::WriteBarrierPtr<Js::CompoundString::Block>::WriteBarrierSet(&this->lastBlock,pBVar4);
  return;
}

Assistant:

void CompoundString::Grow()
    {
        Assert(!IsFinalized());
        Assert(OwnsLastBlock());

        Block *const lastBlock = this->lastBlock;
        if(!lastBlock)
        {
            // There is no last block. Only the buffer was allocated, and is held in 'lastBlockInfo'. In that case it is always
            // within the threshold to resize. Resize the buffer or resize it into a new block depending on its size.
            this->lastBlock = lastBlockInfo.Resize(GetLibrary()->GetRecycler());
            return;
        }

        lastBlockInfo.CopyTo(lastBlock);
        Block *const newLastBlock = lastBlock->Chain(GetLibrary()->GetRecycler());
        lastBlockInfo.CopyFrom(newLastBlock);
        this->lastBlock = newLastBlock;
    }